

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzgeoelrefpattern.h.h
# Opt level: O0

void __thiscall
TPZGeoElRefPattern<pzgeom::TPZArc3D>::TPZGeoElRefPattern(TPZGeoElRefPattern<pzgeom::TPZArc3D> *this)

{
  TPZRegisterClassId *in_RDI;
  void **in_stack_00000008;
  TPZGeoElRefLess<pzgeom::TPZArc3D> *in_stack_00000010;
  int64_t in_stack_ffffffffffffffb8;
  TPZRefPattern *in_stack_ffffffffffffffd8;
  TPZAutoPointer<TPZRefPattern> *in_stack_ffffffffffffffe0;
  
  TPZRegisterClassId::TPZRegisterClassId<TPZGeoElRefPattern<pzgeom::TPZArc3D>>(in_RDI,0x21);
  TPZSavable::TPZSavable((TPZSavable *)in_RDI,&PTR_PTR_0246e3a0);
  TPZGeoElRefLess<pzgeom::TPZArc3D>::TPZGeoElRefLess(in_stack_00000010,in_stack_00000008);
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0246e078;
  *(undefined ***)in_RDI = &PTR__TPZGeoElRefPattern_0246e078;
  TPZVec<long>::TPZVec((TPZVec<long> *)(in_RDI + 0x2f8),in_stack_ffffffffffffffb8);
  TPZAutoPointer<TPZRefPattern>::TPZAutoPointer(in_stack_ffffffffffffffe0,in_stack_ffffffffffffffd8)
  ;
  return;
}

Assistant:

TPZGeoElRefPattern<TGeo>::TPZGeoElRefPattern():TPZRegisterClassId(&TPZGeoElRefPattern<TGeo>::ClassId),
TPZGeoElRefLess<TGeo>(), fSubEl(0), fRefPattern(0)
{
}